

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmGates.c
# Opt level: O2

Vec_Wec_t * Mpm_ManFindDsdMatches(Mpm_Man_t *p,void *pScl)

{
  int iVar1;
  Vec_Wec_t *pVVar2;
  Vec_Int_t *pVVar3;
  undefined8 *puVar4;
  void *pvVar5;
  int i;
  uint uVar6;
  int Config;
  Vec_Wec_t *local_48;
  Mpm_Man_t *local_40;
  word Truth;
  
  iVar1 = p->pPars->fVeryVerbose;
  local_40 = p;
  pVVar2 = (Vec_Wec_t *)malloc(0x10);
  pVVar2->nCap = 600;
  pVVar3 = (Vec_Int_t *)calloc(600,0x10);
  pVVar2->pArray = pVVar3;
  pVVar2->nSize = 600;
  local_48 = pVVar2;
  for (i = 0; i < *(int *)((long)pScl + 0x74); i = i + 1) {
    puVar4 = (undefined8 *)Vec_PtrEntry((Vec_Ptr_t *)((long)pScl + 0x70),i);
    uVar6 = *(uint *)(puVar4 + 8);
    if (((int)uVar6 < 7) && (*(int *)((long)puVar4 + 0x44) < 2)) {
      pvVar5 = Vec_PtrEntry((Vec_Ptr_t *)(puVar4 + 6),uVar6);
      Truth = **(word **)((long)pvVar5 + 0x38);
      Config = Mpm_CutCheckDsd6(local_40,Truth);
      if (Config == 0xffffffff) {
        if (iVar1 != 0) {
          printf("Skipping cell %s with non-DSD function\n",*puVar4);
        }
      }
      else {
        uVar6 = Config >> 0x11;
        Config = Config & 0x1ffffU | *(int *)(puVar4 + 1) << 0x11;
        pVVar3 = Vec_WecEntry(local_48,uVar6);
        Vec_IntPush(pVVar3,Config);
        if (iVar1 != 0) {
          printf("Gate %5d  %-30s : ",(ulong)*(uint *)(puVar4 + 1),*puVar4);
          printf("Class %3d  ",(ulong)uVar6);
          printf("Area %10.3f  ",(double)*(float *)(puVar4 + 3));
          Extra_PrintBinary(_stdout,(uint *)&Config,0x11);
          printf("   ");
          Kit_DsdPrintFromTruth((uint *)&Truth,*(int *)(puVar4 + 8));
          putchar(10);
        }
      }
    }
    else if (iVar1 != 0) {
      printf("Skipping cell %s with %d inputs and %d outputs\n",*puVar4,(ulong)uVar6,
             (ulong)*(uint *)((long)puVar4 + 0x44));
    }
  }
  return local_48;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Finds matches fore each DSD class.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Vec_Wec_t * Mpm_ManFindDsdMatches( Mpm_Man_t * p, void * pScl )
{
    int fVerbose = p->pPars->fVeryVerbose;
    SC_Lib * pLib = (SC_Lib *)pScl;
    Vec_Wec_t * vClasses;
    Vec_Int_t * vClass;
    SC_Cell * pRepr;
    int i, Config, iClass;
    word Truth;
    vClasses = Vec_WecStart( 600 );
    SC_LibForEachCellClass( pLib, pRepr, i )
    {
        if ( pRepr->n_inputs > 6 || pRepr->n_outputs > 1 )
        {
            if ( fVerbose )
            printf( "Skipping cell %s with %d inputs and %d outputs\n", pRepr->pName, pRepr->n_inputs, pRepr->n_outputs );
            continue;
        }
        Truth = *Vec_WrdArray( &SC_CellPin(pRepr, pRepr->n_inputs)->vFunc );
        Config = Mpm_CutCheckDsd6( p, Truth );
        if ( Config == -1 )
        {
            if ( fVerbose )
            printf( "Skipping cell %s with non-DSD function\n", pRepr->pName );
            continue;
        }
        iClass = Config >> 17;
        Config = (pRepr->Id << 17) | (Config & 0x1FFFF);
        // write gate and NPN config for this DSD class
        vClass = Vec_WecEntry( vClasses, iClass );
        Vec_IntPush( vClass, Config );
        if ( !fVerbose )
            continue;

        printf( "Gate %5d  %-30s : ", pRepr->Id, pRepr->pName );
        printf( "Class %3d  ", iClass );
        printf( "Area %10.3f  ", pRepr->area );
        Extra_PrintBinary( stdout, (unsigned *)&Config, 17 );
        printf( "   " );
        Kit_DsdPrintFromTruth( (unsigned *)&Truth, pRepr->n_inputs ); printf( "\n" );
    }
    return vClasses;
}